

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_string_float_limit(char *string,int prec)

{
  int iVar1;
  long lVar2;
  int iVar3;
  char *c;
  
  lVar2 = 0;
  iVar3 = 0;
  do {
    iVar1 = 1;
    if (string[lVar2] != '.') {
      if (string[lVar2] == '\0') goto LAB_0014166f;
      if (iVar3 == 3) {
        string[lVar2] = '\0';
LAB_0014166f:
        return (int)lVar2;
      }
      iVar1 = (uint)(0 < iVar3) + iVar3;
    }
    iVar3 = iVar1;
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

NK_LIB int
nk_string_float_limit(char *string, int prec)
{
    int dot = 0;
    char *c = string;
    while (*c) {
        if (*c == '.') {
            dot = 1;
            c++;
            continue;
        }
        if (dot == (prec+1)) {
            *c = 0;
            break;
        }
        if (dot > 0) dot++;
        c++;
    }
    return (int)(c - string);
}